

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_peek_bitset.hpp
# Opt level: O0

void __thiscall
boost::xpressive::detail::hash_peek_bitset<char>::
set_class<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
          (hash_peek_bitset<char> *this,char_class_type char_class,bool no,
          regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr)

{
  char_type cVar1;
  int_type iVar2;
  int iVar3;
  cpp_regex_traits<char> *in_RCX;
  byte in_DL;
  ushort in_SI;
  undefined8 in_RDI;
  char_type ch;
  size_t i;
  undefined4 in_stack_ffffffffffffffdc;
  bitset<256UL> *this_00;
  
  for (this_00 = (bitset<256UL> *)0x0; this_00 < (bitset<256UL> *)0x100;
      this_00 = (bitset<256UL> *)((long)(this_00->super__Base_bitset<4UL>)._M_w + 1)) {
    iVar2 = (int_type)this_00;
    cVar1 = std::char_traits<char>::to_char_type((int_type *)&stack0xffffffffffffffd8);
    in_stack_ffffffffffffffdc = CONCAT13(cVar1,(int3)in_stack_ffffffffffffffdc);
    iVar3 = cpp_regex_traits<char>::isctype(in_RCX,(int)cVar1,(uint)in_SI);
    if ((in_DL & 1) != ((byte)iVar3 & 1)) {
      std::bitset<256UL>::set
                (this_00,CONCAT44(in_stack_ffffffffffffffdc,iVar2),SUB81((ulong)in_RDI >> 0x38,0));
    }
  }
  return;
}

Assistant:

void set_class(typename Traits::char_class_type char_class, bool no, Traits const &tr)
    {
        if(1 != sizeof(char_type))
        {
            // wide character set, no efficient way of filling in the bitset, so set them all to 1
            this->set_all();
        }
        else
        {
            for(std::size_t i = 0; i <= UCHAR_MAX; ++i)
            {
                char_type ch = std::char_traits<char_type>::to_char_type(static_cast<int_type>(i));
                if(no != tr.isctype(ch, char_class))
                {
                    this->bset_.set(i);
                }
            }
        }
    }